

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O1

AMQP_VALUE amqpvalue_create_composite(AMQP_VALUE descriptor,uint32_t list_size)

{
  int iVar1;
  undefined4 *puVar2;
  AMQP_VALUE pAVar3;
  LOGGER_LOG p_Var4;
  AMQP_VALUE pAVar5;
  
  puVar2 = (undefined4 *)malloc(0x20);
  if (puVar2 == (undefined4 *)0x0) {
    pAVar5 = (AMQP_VALUE)0x0;
  }
  else {
    pAVar5 = (AMQP_VALUE)(puVar2 + 2);
    *puVar2 = 1;
  }
  if (pAVar5 == (AMQP_VALUE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_create_composite",0x1c3b,1,"Cannot allocate memory for composite type");
      return (AMQP_VALUE)0x0;
    }
  }
  else {
    pAVar5->type = AMQP_TYPE_COMPOSITE;
    pAVar3 = amqpvalue_clone(descriptor);
    (pAVar5->value).described_value.descriptor = pAVar3;
    if (pAVar3 == (AMQP_VALUE)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                  ,"amqpvalue_create_composite",0x1c43,1,
                  "Cannot clone descriptor for composite type");
      }
    }
    else {
      pAVar3 = amqpvalue_create_list();
      (pAVar5->value).described_value.value = pAVar3;
      if (pAVar3 == (AMQP_VALUE)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                    ,"amqpvalue_create_composite",0x1c4c,1,"Cannot create list for composite type");
        }
        pAVar3 = (pAVar5->value).described_value.descriptor;
      }
      else {
        iVar1 = amqpvalue_set_list_item_count(pAVar3,list_size);
        if (iVar1 == 0) {
          return pAVar5;
        }
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                    ,"amqpvalue_create_composite",0x1c55,1,
                    "Cannot set list item count for composite type");
        }
        amqpvalue_destroy((pAVar5->value).described_value.descriptor);
        pAVar3 = (pAVar5->value).described_value.value;
      }
      amqpvalue_destroy(pAVar3);
    }
    free((void *)((long)&pAVar5[-1].value + 8));
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_composite(AMQP_VALUE descriptor, uint32_t list_size)
{
    AMQP_VALUE_DATA* result = (AMQP_VALUE_DATA*)REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
    if (result == NULL)
    {
        LogError("Cannot allocate memory for composite type");
    }
    else
    {
        result->type = AMQP_TYPE_COMPOSITE;
        result->value.described_value.descriptor = amqpvalue_clone(descriptor);
        if (result->value.described_value.descriptor == NULL)
        {
            LogError("Cannot clone descriptor for composite type");
            REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
            result = NULL;
        }
        else
        {
            result->value.described_value.value = amqpvalue_create_list();
            if (result->value.described_value.value == NULL)
            {
                LogError("Cannot create list for composite type");
                amqpvalue_destroy(result->value.described_value.descriptor);
                REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
                result = NULL;
            }
            else
            {
                if (amqpvalue_set_list_item_count(result->value.described_value.value, list_size) != 0)
                {
                    LogError("Cannot set list item count for composite type");
                    amqpvalue_destroy(result->value.described_value.descriptor);
                    amqpvalue_destroy(result->value.described_value.value);
                    REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
                    result = NULL;
                }
            }
        }
    }

    return result;
}